

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsCreatePropertyId(char *name,size_t length,JsPropertyIdRef *propertyId)

{
  JsErrorCode JVar1;
  char16_t **local_70;
  JsPropertyIdRef **local_68;
  ulong *local_60;
  char16_t *local_58;
  ulong local_50;
  JsPropertyIdRef *local_48;
  undefined1 local_40 [8];
  NarrowToWide wname;
  char *name_local;
  
  if (name == (char *)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    local_40 = (undefined1  [8])0x0;
    wname._24_8_ = name;
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    Initialize((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                *)local_40,(char **)&wname.freeDst,length);
    if (local_40 == (undefined1  [8])0x0) {
      JVar1 = JsErrorOutOfMemory;
    }
    else {
      local_50 = (ulong)(uint)wname.dst;
      local_70 = &local_58;
      local_58 = (char16_t *)local_40;
      local_60 = &local_50;
      local_68 = &local_48;
      local_48 = propertyId;
      JVar1 = ContextAPINoScriptWrapper_Core<ContextAPINoScriptWrapper_NoRecord<JsGetPropertyIdFromNameInternal(char16_t_const*,unsigned_long,void**)::_lambda(Js::ScriptContext*)_1_>(JsGetPropertyIdFromNameInternal(char16_t_const*,unsigned_long,void**)::_lambda(Js::ScriptContext*)_1_,bool,bool)::_lambda(Js::ScriptContext*)_1_>
                        ((anon_class_24_3_e1295a6b *)&local_70,false,false);
    }
    if ((local_40 != (undefined1  [8])0x0) && ((char)wname.allocateCount == '\x01')) {
      free((void *)local_40);
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsCreatePropertyId(
    _In_z_ const char *name,
    _In_ size_t length,
    _Out_ JsPropertyIdRef *propertyId)
{
    PARAM_NOT_NULL(name);
    utf8::NarrowToWide wname(name, length);
    if (!wname)
    {
        return JsErrorOutOfMemory;
    }

    return JsGetPropertyIdFromNameInternal(wname, wname.Length(), propertyId);
}